

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  char *pcVar6;
  ZSTD_customMem *pZVar7;
  int iVar8;
  ZSTD_DDict *pZVar9;
  char cVar10;
  size_t sVar11;
  size_t bufferSize;
  void *__src;
  char *pcVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ZSTD_frameSizeInfo ZVar18;
  char *op;
  size_t local_b0;
  char *local_90;
  void *local_88;
  char *local_80;
  BYTE *local_78;
  ZSTD_frameHeader *local_70;
  size_t *local_68;
  void *local_60;
  ZSTD_outBuffer *local_58;
  ZSTD_outBuffer *local_50;
  ZSTD_customMem *local_48;
  char *local_40;
  ulong local_38;
  
  uVar16 = input->pos;
  uVar13 = input->size;
  pvVar2 = output->dst;
  uVar15 = output->size;
  uVar3 = output->pos;
  local_90 = (char *)((long)pvVar2 + uVar3);
  local_b0 = 0xffffffffffffffb8;
  local_38 = uVar13 - uVar16;
  if (uVar16 <= uVar13) {
    if (uVar15 < uVar3) {
LAB_00652fc6:
      local_b0 = 0xffffffffffffffba;
    }
    else {
      if ((zds->outBufferMode == ZSTD_bm_stable) && (zds->streamStage != zdss_init)) {
        local_b0 = 0xffffffffffffff98;
        if ((zds->expectedOutBuffer).size == uVar15 &&
            (uVar3 == (zds->expectedOutBuffer).pos && (zds->expectedOutBuffer).dst == pvVar2)) {
          local_b0 = 0;
        }
      }
      else {
        local_b0 = 0;
      }
      if (local_b0 < 0xffffffffffffff89) {
        __src = (void *)(uVar16 + (long)input->src);
        pvVar14 = (void *)(uVar13 + (long)input->src);
        pcVar12 = (char *)((long)pvVar2 + uVar15);
        local_58 = &zds->expectedOutBuffer;
        local_68 = &zds->outStart;
        local_70 = &zds->fParams;
        local_78 = zds->headerBuffer;
        local_48 = &zds->customMem;
        local_80 = pcVar12;
        local_60 = __src;
        local_50 = output;
        local_40 = local_90;
LAB_00653080:
        pcVar6 = local_90;
        bVar5 = true;
        switch(zds->streamStage) {
        case zdss_init:
          goto switchD_006530a3_caseD_0;
        case zdss_loadHeader:
          goto switchD_006530a3_caseD_1;
        case zdss_read:
          goto switchD_006530a3_caseD_2;
        case zdss_load:
          goto LAB_00653703;
        case zdss_flush:
          uVar15 = zds->outEnd - zds->outStart;
          uVar13 = (long)pcVar12 - (long)local_90;
          uVar16 = uVar15;
          if (uVar13 < uVar15) {
            uVar16 = uVar13;
          }
          if (uVar16 != 0) {
            memcpy(local_90,zds->outBuff + zds->outStart,uVar16);
          }
          local_90 = pcVar6 + uVar16;
          sVar11 = *local_68;
          *local_68 = uVar16 + sVar11;
          if (uVar15 <= uVar13) {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < uVar16 + sVar11 + (ulong)(zds->fParams).blockSizeMax)) {
              *local_68 = 0;
              local_68[1] = 0;
            }
          }
          bVar5 = uVar15 <= uVar13;
          pcVar12 = local_80;
          goto LAB_006537ea;
        default:
          return 0xffffffffffffffff;
        }
      }
    }
  }
  return local_b0;
switchD_006530a3_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
  local_68[2] = 0;
  *local_68 = 0;
  local_68[1] = 0;
  local_58->pos = local_50->pos;
  sVar11 = local_50->size;
  local_58->dst = local_50->dst;
  local_58->size = sVar11;
switchD_006530a3_caseD_1:
  sVar11 = ZSTD_getFrameHeader_advanced(local_70,local_78,zds->lhSize,zds->format);
  if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
     (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
    ZSTD_DCtx_selectFrameDDict(zds);
  }
  if (sVar11 < 0xffffffffffffff89) {
    if (sVar11 == 0) {
      iVar8 = 0;
      sVar11 = local_b0;
    }
    else {
      sVar4 = zds->lhSize;
      uVar16 = sVar11 - sVar4;
      uVar13 = (long)pvVar14 - (long)__src;
      if (uVar13 < uVar16) {
        if (pvVar14 != __src) {
          memcpy(local_78 + sVar4,__src,uVar13);
          zds->lhSize = zds->lhSize + uVar13;
        }
        input->pos = input->size;
        uVar16 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
        if (sVar11 < uVar16) {
          sVar11 = uVar16;
        }
        iVar8 = 1;
        pcVar12 = local_80;
        sVar11 = (sVar11 - zds->lhSize) + 3;
      }
      else {
        memcpy(local_78 + sVar4,__src,uVar16);
        zds->lhSize = sVar11;
        __src = (void *)((long)__src + uVar16);
        iVar8 = 6;
        pcVar12 = local_80;
        sVar11 = local_b0;
      }
    }
  }
  else {
    iVar8 = 1;
  }
  uVar16 = local_38;
  pvVar2 = local_60;
  pcVar6 = local_90;
  bVar5 = true;
  local_b0 = sVar11;
  if (iVar8 != 6) {
    if (iVar8 != 0) {
      return sVar11;
    }
    if (((local_70->frameContentSize != 0xffffffffffffffff) &&
        ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
       (uVar13 = (long)pcVar12 - (long)local_90, local_70->frameContentSize <= uVar13)) {
      local_88 = __src;
      ZVar18 = ZSTD_findFrameSizeInfo(local_60,local_38);
      uVar15 = ZVar18.compressedSize;
      if (uVar16 < uVar15) {
        bVar5 = true;
        iVar8 = 0;
        __src = local_88;
      }
      else {
        pZVar9 = ZSTD_getDDict(zds);
        local_b0 = ZSTD_decompressMultiFrame(zds,pcVar6,uVar13,pvVar2,uVar15,(void *)0x0,0,pZVar9);
        if (local_b0 < 0xffffffffffffff89) {
          local_90 = pcVar6 + local_b0;
          zds->expected = 0;
          zds->streamStage = zdss_init;
          bVar5 = false;
          iVar8 = 6;
          __src = (void *)(uVar15 + (long)pvVar2);
          local_b0 = sVar11;
        }
        else {
          iVar8 = 1;
          bVar5 = true;
          __src = local_88;
        }
      }
      pcVar12 = local_80;
      if (iVar8 == 6) goto LAB_006537ea;
      if (iVar8 != 0) {
        return local_b0;
      }
    }
    if (((zds->outBufferMode == ZSTD_bm_stable) && ((zds->fParams).frameType != ZSTD_skippableFrame)
        ) && ((local_70->frameContentSize != 0xffffffffffffffff &&
              ((ulong)((long)pcVar12 - (long)local_90) < local_70->frameContentSize))))
    goto LAB_00652fc6;
    local_88 = __src;
    pZVar9 = ZSTD_getDDict(zds);
    ZSTD_decompressBegin_usingDDict(zds,pZVar9);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar11 = ZSTD_decodeFrameHeader(zds,local_78,zds->lhSize);
      if (0xffffffffffffff88 < sVar11) {
        return sVar11;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    pZVar7 = local_48;
    uVar16 = (zds->fParams).windowSize;
    if (uVar16 < 0x401) {
      uVar16 = 0x400;
    }
    (zds->fParams).windowSize = uVar16;
    if (zds->maxWindowSize < uVar16) {
      return 0xfffffffffffffff0;
    }
    uVar1 = (zds->fParams).blockSizeMax;
    if (uVar1 < 5) {
      uVar1 = 4;
    }
    uVar13 = (ulong)uVar1;
    if (zds->outBufferMode == ZSTD_bm_buffered) {
      uVar15 = 0x20000;
      if (uVar16 < 0x20000) {
        uVar15 = uVar16;
      }
      uVar15 = uVar16 + uVar15 + 0x40;
      uVar16 = local_70->frameContentSize;
      if (uVar15 < local_70->frameContentSize) {
        uVar16 = uVar15;
      }
    }
    else {
      uVar16 = 0;
    }
    uVar15 = uVar16 + uVar13;
    if (zds->outBuffSize + zds->inBuffSize < uVar15 * 3) {
      zds->oversizedDuration = 0;
    }
    else {
      zds->oversizedDuration = zds->oversizedDuration + 1;
    }
    bVar17 = true;
    if (((zds->inBuffSize < uVar13) || (zds->outBuffSize < uVar16)) ||
       (0x7f < zds->oversizedDuration)) {
      if (zds->staticSize == 0) {
        ZSTD_customFree(zds->inBuff,*local_48);
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        pcVar12 = (char *)ZSTD_customMalloc(uVar15,*pZVar7);
        zds->inBuff = pcVar12;
        if (pcVar12 != (char *)0x0) goto LAB_00653601;
      }
      else if (uVar15 <= zds->staticSize - 0x276d8) {
LAB_00653601:
        zds->inBuffSize = uVar13;
        zds->outBuff = zds->inBuff + uVar13;
        zds->outBuffSize = uVar16;
        goto LAB_00653622;
      }
      local_b0 = 0xffffffffffffffc0;
      bVar17 = false;
    }
LAB_00653622:
    if (!bVar17) {
      return local_b0;
    }
    zds->streamStage = zdss_read;
    __src = local_88;
    pcVar12 = local_80;
switchD_006530a3_caseD_2:
    uVar16 = (long)pvVar14 - (long)__src;
    if ((zds->stage - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) {
      uVar13 = uVar16 + (uVar16 == 0);
      if (zds->expected <= uVar13) {
        uVar13 = zds->expected;
      }
    }
    else {
      uVar13 = zds->expected;
    }
    if (uVar13 == 0) {
      zds->streamStage = zdss_init;
      bVar5 = false;
      cVar10 = '\x06';
    }
    else {
      cVar10 = '\0';
      if (uVar13 <= uVar16) {
        sVar11 = ZSTD_decompressContinueStream(zds,&local_90,pcVar12,__src,uVar13);
        bVar17 = sVar11 < 0xffffffffffffff89;
        if (!bVar17) {
          local_b0 = sVar11;
        }
        cVar10 = bVar17 * '\x05' + '\x01';
        if (!bVar17) {
          uVar13 = 0;
        }
        __src = (void *)((long)__src + uVar13);
      }
    }
    if (cVar10 != '\x06') {
      if (cVar10 != '\0') {
        return local_b0;
      }
      if (__src == pvVar14) {
        bVar5 = false;
      }
      else {
        zds->streamStage = zdss_load;
LAB_00653703:
        sVar11 = zds->expected;
        sVar4 = zds->inPos;
        uVar16 = sVar11 - sVar4;
        if (zds->stage == ZSTDds_skipFrame) {
          uVar13 = (long)pvVar14 - (long)__src;
          if (uVar16 < (ulong)((long)pvVar14 - (long)__src)) {
            uVar13 = uVar16;
          }
LAB_0065377d:
          __src = (void *)((long)__src + uVar13);
          zds->inPos = zds->inPos + uVar13;
          if (uVar13 < uVar16) {
            bVar5 = false;
            bVar17 = true;
          }
          else {
            zds->inPos = 0;
            sVar11 = ZSTD_decompressContinueStream(zds,&local_90,pcVar12,zds->inBuff,sVar11);
            bVar17 = sVar11 < 0xffffffffffffff89;
            if (!bVar17) {
              local_b0 = sVar11;
            }
          }
        }
        else {
          if (uVar16 <= zds->inBuffSize - sVar4) {
            uVar13 = (long)pvVar14 - (long)__src;
            if (uVar16 < (ulong)((long)pvVar14 - (long)__src)) {
              uVar13 = uVar16;
            }
            if (uVar13 != 0) {
              memcpy(zds->inBuff + sVar4,__src,uVar13);
            }
            goto LAB_0065377d;
          }
          bVar17 = false;
          local_b0 = 0xffffffffffffffec;
        }
        if (!bVar17) {
          return local_b0;
        }
      }
    }
  }
LAB_006537ea:
  if (!bVar5) {
    input->pos = (long)__src - (long)input->src;
    sVar11 = (long)local_90 - (long)local_50->dst;
    local_50->pos = sVar11;
    local_58->pos = sVar11;
    sVar11 = local_50->size;
    local_58->dst = local_50->dst;
    local_58->size = sVar11;
    if (local_40 == local_90 && local_60 == __src) {
      iVar8 = zds->noForwardProgress;
      zds->noForwardProgress = iVar8 + 1;
      if (0xe < iVar8) {
        if (local_90 == pcVar12) {
          return 0xffffffffffffffba;
        }
        if (__src == pvVar14) {
          return 0xffffffffffffffb8;
        }
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd == zds->outStart) {
      if (zds->hostageByte != 0) {
        if (input->size <= input->pos) {
          zds->streamStage = zdss_read;
          return 1;
        }
        input->pos = input->pos + 1;
      }
      return 0;
    }
    if (zds->hostageByte != 0) {
      return 1;
    }
    input->pos = input->pos - 1;
    zds->hostageByte = 1;
    return 1;
  }
  goto LAB_00653080;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall, "");
            RETURN_ERROR_IF(ip==iend, srcSize_wrong, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}